

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::findDirWatcherFast(DirWatcherGeneric *this,string *dir)

{
  iterator iVar1;
  long lVar2;
  ulong uVar3;
  bool local_3a;
  char local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirv;
  
  uVar3 = dir->_M_string_length;
  if ((this->DirSnap).DirectoryInfo.Filepath._M_string_length <= uVar3) {
    std::__cxx11::string::substr((ulong)&dirv,(ulong)dir);
    std::__cxx11::string::operator=((string *)dir,(string *)&dirv);
    std::__cxx11::string::~string((string *)&dirv);
    uVar3 = dir->_M_string_length;
  }
  if (uVar3 != 1) {
    local_39 = FileSystem::getOSSlash();
    local_3a = false;
    String::split(&dirv,dir,&local_39,&local_3a);
    lVar2 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)dirv.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)dirv.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
              ::find(&(this->Directories)._M_t,
                     (key_type *)
                     ((long)&((dirv.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2
                     ));
      if ((_Rb_tree_header *)iVar1._M_node ==
          &(this->Directories)._M_t._M_impl.super__Rb_tree_header) {
        this = (DirWatcherGeneric *)0x0;
        break;
      }
      this = *(DirWatcherGeneric **)(iVar1._M_node + 2);
      lVar2 = lVar2 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dirv);
  }
  return this;
}

Assistant:

DirWatcherGeneric* DirWatcherGeneric::findDirWatcherFast( std::string dir ) {
	// remove the common base ( dir should always start with the same base as the watcher )
	efASSERT( !dir.empty() );
	efASSERT( dir.size() >= DirSnap.DirectoryInfo.Filepath.size() );
	efASSERT( DirSnap.DirectoryInfo.Filepath ==
			  dir.substr( 0, DirSnap.DirectoryInfo.Filepath.size() ) );

	if ( dir.size() >= DirSnap.DirectoryInfo.Filepath.size() ) {
		dir = dir.substr( DirSnap.DirectoryInfo.Filepath.size() - 1 );
	}

	if ( dir.size() == 1 ) {
		efASSERT( dir[0] == FileSystem::getOSSlash() );
		return this;
	}

	size_t level = 0;
	std::vector<std::string> dirv = String::split( dir, FileSystem::getOSSlash(), false );

	DirWatcherGeneric* watcher = this;

	while ( level < dirv.size() ) {
		// search the dir level in the current watcher
		DirWatchMap::iterator it = watcher->Directories.find( dirv[level] );

		// found? continue with the next level
		if ( it != watcher->Directories.end() ) {
			watcher = it->second;

			level++;
		} else {
			// couldn't found the folder level?
			// directory not watched
			return NULL;
		}
	}

	return watcher;
}